

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::CustomData>
          (Structure *this,CustomData *dest,FileDatabase *db)

{
  ReadFieldArray<1,int,42ul>(this,&dest->typemap,"typemap",db);
  ReadField<1,int>(this,&dest->totlayer,"totlayer",db);
  ReadField<1,int>(this,&dest->maxlayer,"maxlayer",db);
  ReadField<1,int>(this,&dest->totsize,"totsize",db);
  ReadFieldPtrVector<1,std::shared_ptr,Assimp::Blender::CustomDataLayer>
            (this,&dest->layers,"*layers",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure::Convert<CustomData>(
    CustomData& dest,
    const FileDatabase& db
    ) const
{
    ReadFieldArray<ErrorPolicy_Warn>(dest.typemap, "typemap", db);
    ReadField<ErrorPolicy_Warn>(dest.totlayer, "totlayer", db);
    ReadField<ErrorPolicy_Warn>(dest.maxlayer, "maxlayer", db);
    ReadField<ErrorPolicy_Warn>(dest.totsize, "totsize", db);
    ReadFieldPtrVector<ErrorPolicy_Warn>(dest.layers, "*layers", db);

    db.reader->IncPtr(size);
}